

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::sdiv_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  undefined1 *in_RCX;
  APInt AVar4;
  
  bVar2 = isMinSignedValue(RHS);
  if (bVar2) {
    uVar1 = *(uint *)(Overflow + 8);
    if (uVar1 < 0x41) {
      bVar2 = *(ulong *)Overflow == 0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU);
    }
    else {
      uVar3 = countTrailingOnesSlowCase((APInt *)Overflow);
      bVar2 = uVar3 == uVar1;
    }
  }
  else {
    bVar2 = false;
  }
  *in_RCX = bVar2;
  AVar4 = sdiv(this,RHS);
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::sdiv_ov(const APInt &RHS, bool &Overflow) const {
  // MININT/-1  -->  overflow.
  Overflow = isMinSignedValue() && RHS.isAllOnesValue();
  return sdiv(RHS);
}